

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall leveldb::Block::Iter::SeekToFirst(Iter *this)

{
  uint32_t uVar1;
  
  (this->key_)._M_string_length = 0;
  *(this->key_)._M_dataplus._M_p = '\0';
  this->restart_index_ = 0;
  uVar1 = GetRestartPoint(this,0);
  (this->value_).data_ = this->data_ + uVar1;
  (this->value_).size_ = 0;
  ParseNextKey(this);
  return;
}

Assistant:

void SeekToFirst() override {
    SeekToRestartPoint(0);
    ParseNextKey();
  }